

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O0

void mul_mat_gq_6(void *src0,void *src1,float *dst,int m,int n,int k)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  float *in_RDX;
  long in_RSI;
  int in_R8D;
  int in_R9D;
  int ir1;
  int ir0;
  int local_2c;
  int iVar3;
  
  if (in_R9D % 0x20 == 0) {
    for (iVar3 = 0; iVar3 < in_ECX; iVar3 = iVar3 + 1) {
      for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
        vec_dot_gq_6((int)((ulong)in_RSI >> 0x20),in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                     (void *)CONCAT44(in_R9D,iVar3));
        iVar1 = quantize_6_row_size(0);
        in_RSI = in_RSI + iVar1;
      }
      quantize_6_row_size(0);
      iVar1 = in_R8D;
      iVar2 = quantize_6_row_size(0);
      in_RSI = in_RSI - in_R8D * iVar2;
      in_RDX = in_RDX + iVar1;
      in_R8D = iVar1;
    }
    return;
  }
  __assert_fail("k % 32 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                ,0x931,"void mul_mat_gq_6(const void *, const void *, float *, int, int, int)");
}

Assistant:

void mul_mat_gq_6(
    const void * src0,
    const void * src1, // transposed
         float * dst,
    int m, int n, int k) {
    assert(k % 32 == 0);

    for (int ir0 = 0; ir0 < m; ir0++) {
        for (int ir1 = 0; ir1 < n; ir1++) {
            vec_dot_gq_6(k, dst + ir1, src0, src1);
            src1 = (const char *) src1 + quantize_6_row_size(k);
        }
        src0 = (const char *) src0 +   quantize_6_row_size(k);
        src1 = (const char *) src1 - n*quantize_6_row_size(k);

        dst = (float *) dst + n;
    }
}